

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_compute_blob.h
# Opt level: O3

void ncnn::gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_EDX;
  uint uVar11;
  undefined4 extraout_EDX_00;
  int iVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  float fVar18;
  uint uVar19;
  uint uVar21;
  undefined1 auVar20 [16];
  float fVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  
  iVar12 = grid->h * grid->w * grid->d;
  piVar17 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    iVar7 = grid->c;
    if (0 < iVar7) {
      sVar4 = grid->cstep;
      sVar5 = grid->elemsize;
      lVar14 = (long)grid->data + 8;
      lVar15 = 0;
      do {
        if (0 < iVar12) {
          lVar16 = 0;
          do {
            uVar2 = *(undefined8 *)(lVar14 + -8 + lVar16 * 4);
            iVar7 = src->d;
            fVar28 = (float)(iVar7 + -1);
            fVar28 = fVar28 - ABS(ABS((*(float *)(lVar14 + lVar16 * 4) * 0.5 + 0.5) * fVar28) -
                                  fVar28);
            if (fVar28 <= 0.0) {
              fVar28 = 0.0;
            }
            fVar18 = (float)iVar7 + -1.0;
            if (fVar28 <= (float)iVar7 + -1.0) {
              fVar18 = fVar28;
            }
            iVar6 = src->w;
            iVar9 = src->h;
            fVar28 = (float)(iVar6 + -1);
            fVar27 = (float)(iVar9 + -1);
            auVar25._0_4_ = fVar28 - ABS(ABS(((float)uVar2 * 0.5 + 0.5) * fVar28) - fVar28);
            auVar25._4_4_ =
                 fVar27 - ABS(ABS(((float)((ulong)uVar2 >> 0x20) * 0.5 + 0.5) * fVar27) - fVar27);
            auVar25._8_4_ = 0xc0000000;
            auVar25._12_4_ = 0xc0000000;
            auVar25 = maxps(auVar25,_DAT_005a2890);
            auVar23._0_4_ = (float)iVar6 + -1.0;
            auVar23._4_4_ = (float)iVar9 + -1.0;
            auVar23._8_8_ = 0;
            auVar23 = minps(auVar23,auVar25);
            fVar28 = floorf(auVar23._0_4_ + 0.5);
            fVar27 = floorf(auVar23._4_4_ + 0.5);
            fVar18 = floorf(fVar18 + 0.5);
            iVar10 = (int)fVar18;
            iVar8 = -1;
            if ((iVar10 < iVar7) && (-1 < iVar10)) {
              uVar19 = (uint)fVar28;
              uVar21 = (uint)fVar27;
              auVar26._0_4_ = -(uint)((int)uVar19 < iVar6);
              auVar26._4_4_ = auVar26._0_4_;
              auVar26._8_4_ = -(uint)((int)uVar21 < iVar9);
              auVar26._12_4_ = -(uint)((int)uVar21 < iVar9);
              uVar11 = movmskpd(extraout_EDX_00,auVar26);
              if (((byte)((byte)uVar11 >> 1) != 0) &&
                 (((uVar11 & 1) != 0 && (-1 < (int)(uVar21 | uVar19))))) {
                iVar8 = (iVar6 * (iVar9 * iVar10 + uVar21) + uVar19) * src->elempack;
              }
            }
            *piVar17 = iVar8;
            piVar17 = piVar17 + 1;
            lVar16 = lVar16 + 3;
          } while ((int)lVar16 < iVar12);
          iVar7 = grid->c;
        }
        lVar15 = lVar15 + 1;
        lVar14 = lVar14 + sVar4 * sVar5;
      } while (lVar15 < iVar7);
    }
  }
  else if (0 < iVar12) {
    pfVar13 = (float *)grid->data;
    lVar15 = grid->elemsize * grid->cstep;
    do {
      iVar7 = src->d;
      fVar28 = (float)(iVar7 + -1);
      fVar28 = fVar28 - ABS(ABS((*(float *)((long)pfVar13 + lVar15 * 2) * 0.5 + 0.5) * fVar28) -
                            fVar28);
      if (fVar28 <= 0.0) {
        fVar28 = 0.0;
      }
      fVar18 = (float)iVar7 + -1.0;
      if (fVar28 <= (float)iVar7 + -1.0) {
        fVar18 = fVar28;
      }
      uVar1 = src->w;
      uVar3 = src->h;
      fVar28 = (float)(uVar1 + -1);
      fVar27 = (float)(uVar3 + -1);
      auVar22._0_4_ = fVar28 - ABS(ABS((*pfVar13 * 0.5 + 0.5) * fVar28) - fVar28);
      auVar22._4_4_ =
           fVar27 - ABS(ABS((*(float *)((long)pfVar13 + lVar15) * 0.5 + 0.5) * fVar27) - fVar27);
      auVar22._8_4_ = 0xc0000000;
      auVar22._12_4_ = 0xc0000000;
      auVar23 = maxps(auVar22,_DAT_005a2890);
      auVar20._0_4_ = (float)(int)uVar1 + -1.0;
      auVar20._4_4_ = (float)(int)uVar3 + -1.0;
      auVar20._8_8_ = 0;
      auVar23 = minps(auVar20,auVar23);
      fVar28 = floorf(auVar23._0_4_ + 0.5);
      fVar27 = floorf(auVar23._4_4_ + 0.5);
      fVar18 = floorf(fVar18 + 0.5);
      iVar9 = (int)fVar18;
      iVar6 = -1;
      if ((iVar9 < iVar7) && (-1 < iVar9)) {
        uVar19 = (uint)fVar28;
        uVar21 = (uint)fVar27;
        auVar24._0_4_ = -(uint)((int)uVar19 < (int)uVar1);
        auVar24._4_4_ = auVar24._0_4_;
        auVar24._8_4_ = -(uint)((int)uVar21 < (int)uVar3);
        auVar24._12_4_ = -(uint)((int)uVar21 < (int)uVar3);
        uVar11 = movmskpd(extraout_EDX,auVar24);
        if (((byte)((byte)uVar11 >> 1) != 0) &&
           (((uVar11 & 1) != 0 && (-1 < (int)(uVar21 | uVar19))))) {
          iVar6 = (uVar1 * (uVar3 * iVar9 + uVar21) + uVar19) * src->elempack;
        }
      }
      *piVar17 = iVar6;
      pfVar13 = pfVar13 + 1;
      piVar17 = piVar17 + 1;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  return;
}

Assistant:

void gridsample_3d_nearest_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h * grid.d;

    float* offset_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 23 < grid_size; x += 24)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);
                __m256 gz = _mm256_loadu_ps(gridptr + 16);

                transpose3x8_ps(gx, gy, gz);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gz = unormalize(_mm256_set1_ps(src.d), gz);
                gz = get_coord(_mm256_set1_ps(src.d), gz);

                gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
                gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));
                gz = _mm256_floor_ps(_mm256_add_ps(gz, _mm256_set1_ps(0.5f)));

                __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                                  _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));
                v_in_range = _mm256_and_ps(v_in_range, _mm256_and_ps(_mm256_cmp_ps(gz, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), gz, _CMP_GT_OS)));

                __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), gz,
                                              _mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx)),
                                              _mm256_set1_ps(src.elempack));

                offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

                _mm256_storeu_ps(offset_ptr, offset);

                gridptr += 24;
                offset_ptr += 8;
            }

#endif // __AVX__

            for (; x < grid_size; x += 3)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);
                float sample_z = *(gridptr + 2);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                sample_z = unormalize(src.d, sample_z);
                sample_z = get_coord(src.d, sample_z);

                int x0 = static_cast<int>(floorf(sample_x + 0.5f));
                int y0 = static_cast<int>(floorf(sample_y + 0.5f));
                int z0 = static_cast<int>(floorf(sample_z + 0.5f));

                bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h) & (z0 > -1) & (z0 < src.d));

                int* iptr = (int*)offset_ptr;
                *iptr = in_bound ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

                gridptr += 3;
                offset_ptr++;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);
        const float* gridptr_z = grid.channel(2);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);
            __m256 gz = _mm256_loadu_ps(gridptr_z);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gz = unormalize(_mm256_set1_ps(src.d), gz);
            gz = get_coord(_mm256_set1_ps(src.d), gz);

            gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
            gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));
            gz = _mm256_floor_ps(_mm256_add_ps(gz, _mm256_set1_ps(0.5f)));

            __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                              _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));
            v_in_range = _mm256_and_ps(v_in_range, _mm256_and_ps(_mm256_cmp_ps(gz, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), gz, _CMP_GT_OS)));

            __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), gz,
                                          _mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx)),
                                          _mm256_set1_ps(src.elempack));

            offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

            _mm256_storeu_ps(offset_ptr, offset);

            gridptr_x += 8;
            gridptr_y += 8;
            gridptr_z += 8;

            offset_ptr += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;
            float sample_z = *gridptr_z;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            sample_z = unormalize(src.d, sample_z);
            sample_z = get_coord(src.d, sample_z);

            int x0 = static_cast<int>(floorf(sample_x + 0.5f));
            int y0 = static_cast<int>(floorf(sample_y + 0.5f));
            int z0 = static_cast<int>(floorf(sample_z + 0.5f));

            bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h) & (z0 > -1) & (z0 < src.d));

            int* iptr = (int*)offset_ptr;
            *iptr = in_bound ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

            gridptr_x++;
            gridptr_y++;
            gridptr_z++;

            offset_ptr++;
        }
    }
}